

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
FindNextProperty(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
                 *this,ScriptContext *scriptContext,PropertyIndex *index,
                JavascriptString **propertyStringName,PropertyId *propertyId,
                PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
                EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  PropertyIndex PVar1;
  SimpleDictionaryPropertyDescriptor<unsigned_short> SVar2;
  PropertyRecord *pPVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  BOOL BVar8;
  PropertyId propertyId_00;
  undefined4 *puVar9;
  ScriptContext *pSVar10;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar11;
  PropertyRecord **ppPVar12;
  PropertyString *this_00;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar13;
  EnumeratorFlags EVar14;
  DynamicTypeHandler *pDVar15;
  PropertyRecord *local_70;
  PropertyRecord *propertyRecord;
  DynamicTypeHandler *local_60;
  JavascriptString **local_58;
  ScriptContext *local_50;
  EnumeratorFlags *local_48;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *local_40;
  SimpleDictionaryPropertyDescriptor<unsigned_short> local_34 [2];
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptor;
  
  local_48 = attributes;
  local_40 = this;
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x271,"(propertyStringName)","propertyStringName");
    if (!bVar5) goto LAB_00de3948;
    *puVar9 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x272,"(propertyId)","propertyId");
    if (!bVar5) goto LAB_00de3948;
    *puVar9 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x273,"(type)","type");
    if (!bVar5) goto LAB_00de3948;
    *puVar9 = 0;
  }
  if (typeToEnumerate == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x274,"(typeToEnumerate)","typeToEnumerate");
    if (!bVar5) {
LAB_00de3948:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  local_50 = scriptContext;
  if ((DynamicType *)type == typeToEnumerate) {
    uVar7 = (uint)*index;
    pBVar13 = (local_40->propertyMap).ptr;
    local_58 = propertyStringName;
    if ((int)(uint)*index < pBVar13->count - pBVar13->freeCount) {
      do {
        pSVar11 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                  ::GetValueAt(pBVar13,uVar7);
        SVar2 = *pSVar11;
        EVar14 = SVar2.Attributes;
        if ((((uint)SVar2 >> 8 & 0x18) == 0) && (((EVar14 | flags) & EnumNonEnumerable) != None)) {
          ppPVar12 = JsUtil::
                     BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                     ::GetKeyAt((local_40->propertyMap).ptr,(uint)*index);
          pSVar10 = local_50;
          pPVar3 = *ppPVar12;
          if (((flags & EnumSymbols) != None) || (pPVar3->isSymbol == false)) {
            if (local_48 != (EnumeratorFlags *)0x0) {
              *local_48 = EVar14;
            }
            propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_50,pPVar3);
            *propertyId = propertyId_00;
            this_00 = ScriptContext::GetPropertyString(pSVar10,propertyId_00);
            *local_58 = &this_00->super_JavascriptString;
            if (((uint)SVar2 >> 8 & 4) != 0) {
              polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_00);
              propertyRecordUsageCache = PropertyString::GetPropertyRecordUsageCache(this_00);
              PropertyValueInfo::SetCacheInfo
                        (info,(RecyclableObject *)this_00,propertyRecordUsageCache,
                         polymorphicInlineCache,false);
              if (info == (PropertyValueInfo *)0x0) {
                return 1;
              }
              info->m_instance = &instance->super_RecyclableObject;
              info->m_propertyIndex = SVar2.propertyIndex;
              info->m_attributes = EVar14;
              info->flags = InlineCacheNoFlags;
              if (((uint)SVar2 & 6) != 2) {
                *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
                return 1;
              }
              return 1;
            }
            BVar8 = 1;
            goto LAB_00de3848;
          }
        }
        PVar1 = *index;
        *index = PVar1 + 1;
        uVar7 = (uint)(ushort)(PVar1 + 1);
        pBVar13 = (local_40->propertyMap).ptr;
      } while ((int)uVar7 < pBVar13->count - pBVar13->freeCount);
    }
  }
  else {
    pDVar15 = (typeToEnumerate->typeHandler).ptr;
    local_58 = (JavascriptString **)(ulong)flags;
    iVar6 = (*pDVar15->_vptr_DynamicTypeHandler[10])
                      (pDVar15,scriptContext,index,propertyStringName,propertyId,local_48,
                       typeToEnumerate,typeToEnumerate,local_58,instance,info);
    if (iVar6 != 0) {
      propertyRecord = (PropertyRecord *)__tls_get_addr(&PTR_0155fe48);
      local_60 = pDVar15;
      do {
        local_34[0].Attributes = '\a';
        local_34[0]._0_1_ = (local_34[0]._0_1_ & 0xf0) + 1;
        local_34[0].propertyIndex = 0xffff;
        if (*propertyId == -1) {
          if (*propertyStringName != (JavascriptString *)0x0) {
            pBVar13 = (local_40->propertyMap).ptr;
            uVar7 = JsUtil::
                    BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                    ::FindEntryWithKey<Js::JavascriptString*>
                              ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                                *)pBVar13,propertyStringName);
            bVar5 = -1 < (int)uVar7;
            scriptContext = local_50;
            if (bVar5) {
              local_34[0] = *(SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                             ((pBVar13->entries).ptr + uVar7);
            }
            goto LAB_00de376f;
          }
        }
        else {
          pSVar10 = Js::Type::GetScriptContext(type);
          local_70 = ScriptContext::GetPropertyName(pSVar10,*propertyId);
          if (((flags & EnumSymbols) == None) && (local_70->isSymbol == true)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pPVar3 = propertyRecord;
            *(undefined4 *)
             &(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x2b7,
                                        "(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol())"
                                        ,
                                        "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols"
                                       );
            if (!bVar5) goto LAB_00de3948;
            *(undefined4 *)
             &(pPVar3->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject = 0;
            pDVar15 = local_60;
          }
          bVar5 = JsUtil::
                  BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                  ::TryGetValue<Js::PropertyRecord_const*>
                            ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                              *)(local_40->propertyMap).ptr,&local_70,local_34);
LAB_00de376f:
          if (((bVar5 != false) && (((uint)local_34[0] & 0x1800) == 0)) &&
             (((local_34[0].Attributes | flags) & EnumNonEnumerable) != None)) {
            if (local_48 != (EnumeratorFlags *)0x0) {
              *local_48 = local_34[0].Attributes;
            }
            if (info != (PropertyValueInfo *)0x0) {
              info->m_instance = &instance->super_RecyclableObject;
              info->m_propertyIndex = 0xffff;
              info->m_attributes = '\0';
              info->flags = InlineCacheNoFlags;
            }
            return 1;
          }
        }
        *index = *index + 1;
        iVar6 = (*pDVar15->_vptr_DynamicTypeHandler[10])
                          (pDVar15,scriptContext,index,propertyStringName,propertyId,local_48,
                           typeToEnumerate,typeToEnumerate,local_58,instance,info);
      } while (iVar6 != 0);
    }
  }
  BVar8 = 0;
LAB_00de3848:
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
  return BVar8;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);
        Assert(typeToEnumerate);

        if(type == typeToEnumerate)
        {
            for( ; index < propertyMap->Count(); ++index )
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(index));
                if( !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (descriptor.Attributes & PropertyEnumerable)))
                {
                    TMapKey key = propertyMap->GetKeyAt(index);

                    // Skip this property if it is a symbol and we are not including symbol properties
                    if (!(flags & EnumeratorFlags::EnumSymbols) && TMapKey_IsSymbol(key, scriptContext))
                    {
                        continue;
                    }

                    if (attributes != nullptr)
                    {
                        *attributes = descriptor.Attributes;
                    }

                    *propertyId = TMapKey_GetPropertyId(scriptContext, key);
                    PropertyString* propertyString = scriptContext->GetPropertyString(*propertyId);
                    *propertyStringName = propertyString;
                    if (descriptor.Attributes & PropertyWritable)
                    {
                        PropertyValueInfo::SetCacheInfo(info, propertyString, propertyString->GetLdElemInlineCache(), false);
                        SetPropertyValueInfo(info, instance, &descriptor);
                    }
                    else
                    {
                        PropertyValueInfo::SetNoCache(info, instance);
                    }
                    return TRUE;
                }
            }
            PropertyValueInfo::SetNoCache(info, instance);

            return FALSE;
        }

        // Need to enumerate a different type than the current one. This is because type snapshot enumerate is enabled and the
        // object's type changed since enumeration began, so need to enumerate properties of the initial type.
        DynamicTypeHandler *const typeHandlerToEnumerate = typeToEnumerate->GetTypeHandler();
        for(
            ;
            typeHandlerToEnumerate->FindNextProperty(
                scriptContext,
                index,
                propertyStringName,
                propertyId,
                attributes,
                typeToEnumerate,
                typeToEnumerate,
                flags,
                instance,
                info);
            ++index)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
            bool hasValue = false;
            if (*propertyId != Constants::NoProperty)
            {
                PropertyRecord const* propertyRecord = type->GetScriptContext()->GetPropertyName(*propertyId);

                AssertMsg(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol(),
                    "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols");

                hasValue = propertyMap->TryGetValue(propertyRecord, &descriptor);
            }
            else if (*propertyStringName != nullptr)
            {
                hasValue = propertyMap->TryGetValue(*propertyStringName, &descriptor);
            }

            if (hasValue &&
                !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) &&
                (!!(flags & EnumeratorFlags::EnumNonEnumerable) || descriptor.Attributes & PropertyEnumerable))
            {
                if (attributes != nullptr)
                {
                    *attributes = descriptor.Attributes;
                }
                PropertyValueInfo::SetNoCache(info, instance);
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }